

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O1

Am_Object find_obj_slot(int x,int y,Am_Object *ref_obj,bool source,Am_Slot_Key *slot,Places *place)

{
  undefined2 uVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  Am_Value *pAVar6;
  ostream *poVar7;
  long *plVar8;
  undefined7 in_register_00000009;
  Am_Slot_Key *pAVar9;
  undefined4 in_register_0000003c;
  Am_Object *pAVar10;
  int *in_stack_00000008;
  Am_Object obj;
  Am_Value v;
  Am_Object local_78;
  Places *local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object_Data *local_48;
  Am_Value local_40;
  
  local_48 = (Am_Object_Data *)CONCAT44(in_register_0000003c,x);
  pAVar10 = &local_78;
  local_70 = place;
  Am_Point_In_Part(pAVar10,0x111480,y,(Am_Object *)((ulong)ref_obj & 0xffffffff),source,false);
  local_40.type = 0;
  local_40.value.wrapper_value = (Am_Wrapper *)0x0;
  cVar2 = Am_Object::Valid();
  if (cVar2 == '\0') {
    cVar2 = '\0';
  }
  else {
    Am_Object::Am_Object(&local_50,&circuit_object_proto);
    cVar2 = Am_Object::Is_Instance_Of((Am_Object_Data *)&local_78);
    Am_Object::~Am_Object(&local_50);
  }
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"** Wrong type obj for wire: ",0x1c);
    plVar8 = (long *)operator<<((ostream *)&std::cout,&local_78);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  }
  else {
    if ((char)slot != '\0') {
      *(Am_Slot_Key *)local_70 = OUTPUT_1;
      *in_stack_00000008 = 3;
      goto LAB_001066b6;
    }
    Am_Object::Am_Object(&local_58,&zero_one_proto);
    cVar3 = Am_Object::Is_Instance_Of((Am_Object_Data *)&local_78);
    cVar2 = '\x01';
    if (cVar3 == '\0') {
      Am_Object::Am_Object(&local_60,&not_proto);
      cVar2 = Am_Object::Is_Instance_Of((Am_Object_Data *)&local_78);
      Am_Object::~Am_Object(&local_60);
    }
    Am_Object::~Am_Object(&local_58);
    if (cVar2 == '\0') {
      bVar4 = is_at_top((int)ref_obj,(Am_Object *)CONCAT71(in_register_00000009,source),&local_78);
      pAVar9 = &INPUT_2;
      if (bVar4) {
        pAVar9 = &INPUT_1;
      }
      iVar5 = 2 - (uint)bVar4;
    }
    else {
      iVar5 = 0;
      pAVar9 = &INPUT_1;
    }
    uVar1 = *pAVar9;
    *(undefined2 *)local_70 = uVar1;
    *in_stack_00000008 = iVar5;
    pAVar10 = &local_78;
    pAVar6 = (Am_Value *)Am_Object::Get((ushort)pAVar10,(ulong)(ushort)uVar1);
    Am_Value::operator=(&local_40,pAVar6);
    cVar2 = Am_Value::Valid();
    if (cVar2 == '\0') goto LAB_001066b6;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"** Object at output end ",0x18);
    poVar7 = (ostream *)operator<<((ostream *)&std::cout,&local_78);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7," already has another object as input= ",0x26);
    plVar8 = (long *)operator<<(poVar7,&local_78);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  }
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  std::ostream::flush();
  Am_Object::Am_Object(&local_68,&circuit_win);
  Am_Beep((Am_Object_Data *)&local_68);
  Am_Object::~Am_Object(&local_68);
  pAVar10 = (Am_Object *)&Am_No_Object;
LAB_001066b6:
  Am_Object::Am_Object((Am_Object *)local_48,pAVar10);
  Am_Value::~Am_Value(&local_40);
  Am_Object::~Am_Object(&local_78);
  return (Am_Object)local_48;
}

Assistant:

Am_Object find_obj_slot(int x, int y, Am_Object &ref_obj, bool source,
			Am_Slot_Key &slot, Places &place) {
  Am_Object obj = Am_Point_In_Part(created_objs, x, y, ref_obj);
  Am_Value v;
  if (obj.Valid() && obj.Is_Instance_Of(circuit_object_proto)) {
    if (source) {
      slot = OUTPUT_1;
      place = center_right;
      return obj;
    }
    else { // is destination
      if (obj.Is_Instance_Of(zero_one_proto) ||
	  obj.Is_Instance_Of(not_proto)) {
	slot = INPUT_1;
	place = center_left;
      }
      else {
	if (is_at_top(y, ref_obj, obj)) {
	  slot = INPUT_1;
	  place = top_left;
	}
	else {
	  slot = INPUT_2;
	  place = bottom_left;
	}
      }
      // destinations can only have one per place
      v = obj.Peek(slot);
      if (v.Valid()) 
	cout << "** Object at output end " << obj
	     << " already has another object as input= " << obj
	     << endl << flush;
      else return obj;
    }
  }
  else cout << "** Wrong type obj for wire: " << obj << endl << flush;
  //if get here, then failed
  Am_Beep(circuit_win);
  return Am_No_Object;
}